

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O0

SUNAdaptController SUNAdaptController_PI(SUNContext_conflict sunctx)

{
  SUNAdaptController p_Var1;
  sunrealtype in_RDI;
  SUNAdaptController C;
  SUNContext_conflict sunctx_local_scope_;
  sunrealtype k1;
  
  k1 = in_RDI;
  p_Var1 = SUNAdaptController_Soderlind((SUNContext_conflict)C);
  SUNAdaptController_SetParams_PI(C,k1,in_RDI);
  return p_Var1;
}

Assistant:

SUNAdaptController SUNAdaptController_PI(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  SUNAdaptController C = SUNAdaptController_Soderlind(sunctx);
  SUNCheckLastErrNull();

  SUNCheckCallNull(
    SUNAdaptController_SetParams_PI(C, DEFAULT_PI_K1, DEFAULT_PI_K2));

  return (C);
}